

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O2

void __thiscall ParamSurface::buildmesh(ParamSurface *this)

{
  undefined8 uVar1;
  vec2f vt1;
  vec2f vt2;
  vec2f vt3;
  vec2f vt3_00;
  vec2f vt2_00;
  vec2f vt1_00;
  Triangle *pTVar2;
  long lVar3;
  BasicContainer *this_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar4;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar5;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vec3f vVar18;
  vec3f v1;
  vec3f v2;
  vec3f v2_00;
  vec3f v3;
  vec3f v3_00;
  Triangle *local_1d0;
  float local_1c8;
  vec3f local_1c0;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> trigs;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar8 = 0.0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  while (fVar6 = fVar8, fVar6 + 0.005 < 1.0) {
    local_198 = fVar6 + 0.01;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar4 = 0.0;
    uStack_194 = uVar11;
    uStack_190 = uVar12;
    uStack_18c = uVar13;
    while (fVar8 = local_198, uVar11 = uStack_194, uVar12 = uStack_190, uVar13 = uStack_18c,
          fVar4 + 0.005 < 1.0) {
      local_78 = 0;
      local_70 = 0;
      local_88 = 0;
      local_80 = 0;
      local_1a8 = fVar4;
      fStack_1a4 = fVar14;
      fStack_1a0 = fVar15;
      fStack_19c = fVar16;
      (*(this->super_Primitive)._vptr_Primitive[3])(fVar6,this,&local_78,&local_88);
      fVar16 = fStack_19c;
      fVar15 = fStack_1a0;
      fVar14 = fStack_1a4;
      fVar7 = local_1a8 + 0.01;
      fVar8 = fVar7;
      (*(this->super_Primitive)._vptr_Primitive[3])(fVar6,this,&local_78,&local_88);
      fVar9 = local_1a8;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_198,this,&local_78,&local_88);
      fVar5 = fVar7;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_198,this,&local_78,&local_88);
      local_1c8 = fVar4 - fVar8;
      local_1d0._4_4_ = extraout_XMM0_Db - extraout_XMM0_Db_00;
      local_1d0._0_4_ = extraout_XMM0_Da - extraout_XMM0_Da_00;
      local_48 = extraout_XMM0_Da - extraout_XMM0_Da_01;
      fStack_44 = extraout_XMM0_Db - extraout_XMM0_Db_01;
      fStack_40 = extraout_XMM0_Dc - extraout_XMM0_Dc_01;
      fStack_3c = extraout_XMM0_Dd - extraout_XMM0_Dd_01;
      local_1c0.z = fVar4 - fVar9;
      local_1c0.y = fStack_44;
      local_1c0.x = local_48;
      local_1b4 = fVar5;
      local_1b0 = local_1c0.z;
      local_1ac = local_1c8;
      local_58 = extraout_XMM0_Da_02;
      fStack_54 = extraout_XMM0_Db_02;
      fStack_50 = extraout_XMM0_Dc_02;
      fStack_4c = extraout_XMM0_Dd_02;
      vVar18 = cross((vec3f *)&local_1d0,&local_1c0);
      local_68 = local_198;
      fStack_64 = local_1a8;
      uStack_60 = uStack_190;
      uStack_5c = uStack_18c;
      if (1e-12 < SQRT(vVar18.z * vVar18.z + vVar18.x * vVar18.x + vVar18.y * vVar18.y)) {
        pTVar2 = (Triangle *)operator_new(0xa0);
        vt3_00.y = fVar7;
        vt3_00.x = fVar6;
        vVar18.y = extraout_XMM0_Db;
        vVar18.x = extraout_XMM0_Da;
        v2.y = extraout_XMM0_Db_01;
        v2.x = extraout_XMM0_Da_01;
        v3.y = extraout_XMM0_Db_00;
        v3.x = extraout_XMM0_Da_00;
        vt2_00.y = fStack_64;
        vt2_00.x = local_68;
        vVar18.z = fVar4;
        v2.z = fVar9;
        v3.z = fVar8;
        vt1.y = local_1a8;
        vt1.x = fVar6;
        local_180 = fVar6;
        fStack_17c = fVar7;
        Triangle::Triangle(pTVar2,vVar18,v2,v3,vt1,vt2_00,vt3_00,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_1d0 = pTVar2;
        std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::emplace_back<BasicPrimitive*>
                  ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                   (BasicPrimitive **)&local_1d0);
      }
      local_1c8 = local_1ac;
      local_1c0.y = fStack_44;
      local_1c0.x = local_48;
      local_1c0.z = local_1b0;
      vVar18 = cross((vec3f *)&local_1d0,&local_1c0);
      if (1e-12 < SQRT(vVar18.z * vVar18.z + vVar18.x * vVar18.x + vVar18.y * vVar18.y)) {
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar11 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar11;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar11;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar11;
      }
      local_1a8 = local_58 - extraout_XMM0_Da_00;
      fStack_1a4 = fStack_54 - extraout_XMM0_Db_00;
      fStack_1a0 = fStack_50 - extraout_XMM0_Dc_00;
      fStack_19c = fStack_4c - extraout_XMM0_Dd_00;
      fVar17 = local_1b4 - fVar8;
      local_1d0._4_4_ = fStack_1a4;
      local_1d0._0_4_ = local_1a8;
      fVar4 = local_58 - extraout_XMM0_Da_01;
      fVar5 = fStack_54 - extraout_XMM0_Db_01;
      fVar10 = local_1b4 - fVar9;
      local_1c0.y = fVar5;
      local_1c0.x = fVar4;
      local_1c8 = fVar17;
      local_1c0.z = fVar10;
      vVar18 = cross((vec3f *)&local_1d0,&local_1c0);
      if (1e-12 < SQRT(vVar18.z * vVar18.z + vVar18.x * vVar18.x + vVar18.y * vVar18.y)) {
        pTVar2 = (Triangle *)operator_new(0xa0);
        vt3.y = fVar7;
        vt3.x = fVar6;
        v1.y = extraout_XMM0_Db_01;
        v1.x = extraout_XMM0_Da_01;
        v2_00.y = fStack_54;
        v2_00.x = local_58;
        v3_00.y = extraout_XMM0_Db_00;
        v3_00.x = extraout_XMM0_Da_00;
        vt1_00.y = fStack_64;
        vt1_00.x = local_68;
        v1.z = fVar9;
        v2_00.z = local_1b4;
        v3_00.z = fVar8;
        vt2.y = fVar7;
        vt2.x = local_198;
        local_188 = fVar6;
        fStack_184 = fVar7;
        Triangle::Triangle(pTVar2,v1,v2_00,v3_00,vt1_00,vt2,vt3,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_1d0 = pTVar2;
        std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::emplace_back<BasicPrimitive*>
                  ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                   (BasicPrimitive **)&local_1d0);
      }
      local_1d0._4_4_ = fStack_1a4;
      local_1d0._0_4_ = local_1a8;
      local_1c8 = fVar17;
      local_1c0.z = fVar10;
      vVar18 = cross((vec3f *)&local_1d0,&local_1c0);
      fVar4 = fVar7;
      if (1e-12 < SQRT(vVar18.z * vVar18.z + vVar18.x * vVar18.x + vVar18.y * vVar18.y)) {
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar11 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar11;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar11;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar11;
      }
    }
  }
  this_00 = (BasicContainer *)operator_new(0x40);
  BasicContainer::BasicContainer(this_00,&trigs);
  this->mesh = this_00;
  std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base
            (&trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>);
  return;
}

Assistant:

void buildmesh()
	{
		// build approximating mesh
		float step = 0.01;
		std::vector<BasicPrimitive*> trigs;
		for (float i=0; i+step/2<1; i+=step)
			for (float j=0; j+step/2<1; j+=step)
			{
				vec3f t1,t2,t; // dummy vars
				vec3f p00 = surface(i,j,t1,t2);
				vec3f p01 = surface(i,j+step,t1,t2);
				vec3f p10 = surface(i+step,j,t1,t2);
				vec3f p11 = surface(i+step,j+step,t1,t2);
				vec2f u00 = vec2f(i,j);
				vec2f u01 = vec2f(i,j+step);
				vec2f u10 = vec2f(i+step,j);
				vec2f u11 = vec2f(i+step,j+step);
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				trigs.push_back(new Triangle(p00,p10,p01,u00,u10,u01,t,t,t));
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				trigs.push_back(new Triangle(p10,p11,p01,u10,u11,u01,t,t,t));
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
			}
		mesh = new BasicContainer(trigs);
	}